

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tracker_manager.cpp
# Opt level: O1

bool __thiscall
libtorrent::aux::tracker_manager::incoming_packet
          (tracker_manager *this,string_view hostname,span<const_char> buf)

{
  ulong uVar1;
  __node_base_ptr p_Var2;
  udp_tracker_connection *this_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_01;
  session_logger *psVar3;
  bool bVar4;
  uint ret;
  uint uVar5;
  _Hash_node_base *p_Var6;
  long lVar7;
  ulong uVar8;
  uint ret_1;
  uint uVar9;
  __node_base_ptr p_Var10;
  __node_base_ptr p_Var11;
  long *local_48 [2];
  long local_38 [2];
  
  uVar5 = 0;
  uVar9 = 0;
  if (0xf < buf.m_len) {
    lVar7 = 0;
    do {
      uVar5 = uVar5 << 8 | (uint)(byte)buf.m_ptr[lVar7];
      lVar7 = lVar7 + 1;
    } while (lVar7 != 4);
    uVar9 = 0;
    if (uVar5 < 4) {
      lVar7 = 4;
      do {
        uVar9 = uVar9 << 8 | (uint)(byte)buf.m_ptr[lVar7];
        lVar7 = lVar7 + 1;
      } while (lVar7 != 8);
      uVar1 = (this->m_udp_conns)._M_h._M_bucket_count;
      uVar8 = (ulong)uVar9 % uVar1;
      p_Var2 = (this->m_udp_conns)._M_h._M_buckets[uVar8];
      p_Var10 = (__node_base_ptr)0x0;
      if ((p_Var2 != (__node_base_ptr)0x0) &&
         (p_Var11 = p_Var2->_M_nxt, p_Var10 = p_Var2, uVar9 != *(uint *)&p_Var11[1]._M_nxt)) {
        while (p_Var6 = p_Var11->_M_nxt, p_Var6 != (_Hash_node_base *)0x0) {
          p_Var10 = (__node_base_ptr)0x0;
          if (((ulong)*(uint *)&p_Var6[1]._M_nxt % uVar1 != uVar8) ||
             (p_Var10 = p_Var11, p_Var11 = p_Var6, uVar9 == *(uint *)&p_Var6[1]._M_nxt))
          goto LAB_0037e7e4;
        }
        p_Var10 = (__node_base_ptr)0x0;
      }
LAB_0037e7e4:
      if (p_Var10 == (__node_base_ptr)0x0) {
        p_Var6 = (_Hash_node_base *)0x0;
      }
      else {
        p_Var6 = p_Var10->_M_nxt;
      }
      if (p_Var6 == (_Hash_node_base *)0x0) {
        psVar3 = this->m_ses;
        local_48[0] = local_38;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_48,hostname._M_str,hostname._M_str + hostname._M_len);
        (*psVar3->_vptr_session_logger[1])
                  (psVar3,"incoming UDP tracker packet from %s has invalid transaction ID (%x)",
                   local_48[0],(ulong)uVar9);
        if (local_48[0] != local_38) {
          operator_delete(local_48[0],local_38[0] + 1);
        }
        uVar9 = 0;
      }
      else {
        this_00 = (udp_tracker_connection *)p_Var6[2]._M_nxt;
        this_01 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)p_Var6[3]._M_nxt;
        if (this_01 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            this_01->_M_use_count = this_01->_M_use_count + 1;
            UNLOCK();
          }
          else {
            this_01->_M_use_count = this_01->_M_use_count + 1;
          }
        }
        bVar4 = udp_tracker_connection::on_receive_hostname(this_00,hostname,buf);
        uVar9 = (uint)bVar4;
        if (this_01 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_01);
        }
      }
    }
  }
  return SUB41(uVar9,0);
}

Assistant:

bool tracker_manager::incoming_packet(string_view const hostname
		, span<char const> const buf)
	{
		TORRENT_ASSERT(is_single_thread());
		// ignore packets smaller than 8 bytes
		if (buf.size() < 16) return false;

		// the first word is the action, if it's not [0, 3]
		// it's not a valid udp tracker response
		span<const char> ptr = buf;
		std::uint32_t const action = aux::read_uint32(ptr);
		if (action > 3) return false;

		std::uint32_t const transaction = aux::read_uint32(ptr);
		auto const i = m_udp_conns.find(transaction);

		if (i == m_udp_conns.end())
		{
#ifndef TORRENT_DISABLE_LOGGING
			// now, this may not have been meant to be a tracker response,
			// but chances are pretty good, so it's probably worth logging
			m_ses.session_log("incoming UDP tracker packet from %s has invalid "
				"transaction ID (%x)", std::string(hostname).c_str(), int(transaction));
#endif
			return false;
		}

		auto const p = i->second;
		// on_receive() may remove the tracker connection from the list
		return p->on_receive_hostname(hostname, buf);
	}